

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<capnp::JsonCodec::AnnotatedHandler> __thiscall
kj::
heap<capnp::JsonCodec::AnnotatedHandler,capnp::JsonCodec&,capnp::StructSchema&,kj::Maybe<capnp::json::DiscriminatorOptions::Reader>&,kj::Maybe<kj::StringPtr>&,kj::Vector<capnp::Schema>&>
          (kj *this,JsonCodec *params,StructSchema *params_1,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *params_2,Maybe<kj::StringPtr> *params_3,
          Vector<capnp::Schema> *params_4)

{
  AnnotatedHandler *this_00;
  AnnotatedHandler *extraout_RDX;
  Own<capnp::JsonCodec::AnnotatedHandler> OVar1;
  Maybe<kj::StringPtr> local_80;
  Maybe<capnp::json::DiscriminatorOptions::Reader> local_68;
  
  this_00 = (AnnotatedHandler *)operator_new(0xd8);
  local_68.ptr.isSet = (params_2->ptr).isSet;
  if (local_68.ptr.isSet == true) {
    local_68.ptr.field_1.value._reader.segment = (params_2->ptr).field_1.value._reader.segment;
    local_68.ptr.field_1.value._reader.capTable = (params_2->ptr).field_1.value._reader.capTable;
    local_68.ptr.field_1.value._reader.data = (params_2->ptr).field_1.value._reader.data;
    local_68.ptr.field_1.value._reader.pointers = (params_2->ptr).field_1.value._reader.pointers;
    local_68.ptr.field_1._32_4_ = *(StructDataBitCount *)((long)&(params_2->ptr).field_1 + 0x20);
    local_68.ptr.field_1._36_2_ = *(StructPointerCount *)((long)&(params_2->ptr).field_1 + 0x24);
    local_68.ptr.field_1._38_2_ = *(undefined2 *)((long)&(params_2->ptr).field_1 + 0x26);
    local_68.ptr.field_1._40_8_ = *(undefined8 *)&(params_2->ptr).field_1.value._reader.nestingLimit
    ;
  }
  local_80.ptr.isSet = (params_3->ptr).isSet;
  if (local_80.ptr.isSet == true) {
    local_80.ptr.field_1.value.content.ptr = (params_3->ptr).field_1.value.content.ptr;
    local_80.ptr.field_1.value.content.size_ = (params_3->ptr).field_1.value.content.size_;
  }
  capnp::JsonCodec::AnnotatedHandler::AnnotatedHandler
            (this_00,params,(StructSchema)(params_1->super_Schema).raw,&local_68,&local_80,params_4)
  ;
  *(undefined8 **)this = &_::HeapDisposer<capnp::JsonCodec::AnnotatedHandler>::instance;
  *(AnnotatedHandler **)(this + 8) = this_00;
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}